

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_InitPIN(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_UTF8CHAR_PTR pPin,CK_ULONG ulPinLen)

{
  Session *this_00;
  CK_STATE CVar1;
  Token *pTVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RDI;
  ByteString userPIN;
  Token *token;
  Session *session;
  Session *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  ByteString *in_stack_ffffffffffffffa0;
  CK_SESSION_HANDLE in_stack_ffffffffffffffc0;
  HandleManager *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      CVar1 = Session::getState(in_stack_ffffffffffffff78);
      if (CVar1 == 4) {
        pTVar2 = Session::getToken(this_00);
        if (pTVar2 == (Token *)0x0) {
          local_8 = 5;
        }
        else if (in_RDX == 0) {
          local_8 = 7;
        }
        else if ((in_RCX < 4) || (0xff < in_RCX)) {
          local_8 = 0xa2;
        }
        else {
          ByteString::ByteString
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
          local_8 = Token::initUserPIN((Token *)userPIN.byteString.
                                                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (ByteString *)
                                       userPIN.byteString.
                                       super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
          ByteString::~ByteString((ByteString *)0x162124);
        }
      }
      else {
        local_8 = 0x101;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_InitPIN(CK_SESSION_HANDLE hSession, CK_UTF8CHAR_PTR pPin, CK_ULONG ulPinLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// The SO must be logged in
	if (session->getState() != CKS_RW_SO_FUNCTIONS) return CKR_USER_NOT_LOGGED_IN;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the PIN
	if (pPin == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (ulPinLen < MIN_PIN_LEN || ulPinLen > MAX_PIN_LEN) return CKR_PIN_LEN_RANGE;

	ByteString userPIN(pPin, ulPinLen);

	return token->initUserPIN(userPIN);
}